

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O3

int Cbs_ManResolve(Cbs_Man_t *p,int Level,int hClause0,int hClause1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t **ppGVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  ppGVar4 = (p->pClauses).pData;
  lVar10 = (long)Level;
  if (ppGVar4[lVar10] == (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[hClause0] != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x2b9,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
  }
  lVar9 = (long)hClause0;
  if (ppGVar4[lVar10] != ppGVar4[lVar9]) {
    __assert_fail("pQue->pData[hClause0] == pQue->pData[hClause1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x2ba,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
  }
  iVar6 = (p->pClauses).iHead;
  if (iVar6 != (p->pClauses).iTail) {
    __assert_fail("Cbs_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x2c1,"int Cbs_ManResolve(Cbs_Man_t *, int, int, int)");
  }
  if (iVar6 == (p->pClauses).nSize) {
    (p->pClauses).nSize = iVar6 * 2;
    ppGVar4 = (Gia_Obj_t **)realloc(ppGVar4,(long)iVar6 << 4);
    iVar6 = (p->pClauses).iTail;
    (p->pClauses).pData = ppGVar4;
  }
  iVar5 = iVar6 + 1;
  (p->pClauses).iTail = iVar5;
  ppGVar4[iVar6] = (Gia_Obj_t *)0x0;
  ppGVar4 = (p->pClauses).pData;
  pGVar7 = ppGVar4[lVar10 + 1];
  if (pGVar7 == (Gia_Obj_t *)0x0) {
    iVar6 = -1;
  }
  else {
    lVar10 = (lVar10 + 1) * 8;
    iVar6 = -1;
    do {
      lVar10 = lVar10 + 8;
      if (((uint)*(ulong *)pGVar7 >> 0x1e & 1) != 0) {
        *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
        if (((ulong)pGVar7 & 1) != 0) goto LAB_0071cd31;
        iVar8 = (p->pClauses).iTail;
        if (iVar8 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar8 * 2;
          ppGVar4 = (p->pClauses).pData;
          if (ppGVar4 == (Gia_Obj_t **)0x0) {
            ppGVar4 = (Gia_Obj_t **)malloc((long)iVar8 << 4);
          }
          else {
            ppGVar4 = (Gia_Obj_t **)realloc(ppGVar4,(long)iVar8 << 4);
            iVar8 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = ppGVar4;
        }
        else {
          ppGVar4 = (p->pClauses).pData;
        }
        iVar5 = iVar8 + 1;
        (p->pClauses).iTail = iVar5;
        ppGVar4[iVar8] = pGVar7;
        uVar1 = pGVar7->Value;
        if (uVar1 == 0xffffffff) goto LAB_0071cd12;
        uVar3 = uVar1 * 3;
        if ((int)uVar3 < 0) goto LAB_0071ccf3;
        uVar2 = p->vLevReas->nSize;
        if (uVar2 == uVar3 || SBORROW4(uVar2,uVar3) != (int)(uVar2 + uVar1 * -3) < 0)
        goto LAB_0071ccf3;
        iVar8 = p->vLevReas->pArray[uVar3];
        if (iVar6 <= iVar8) {
          iVar6 = iVar8;
        }
        ppGVar4 = (p->pClauses).pData;
      }
      pGVar7 = *(Gia_Obj_t **)((long)ppGVar4 + lVar10);
    } while (pGVar7 != (Gia_Obj_t *)0x0);
  }
  pGVar7 = ppGVar4[lVar9 + 1];
  if (pGVar7 != (Gia_Obj_t *)0x0) {
    lVar10 = (lVar9 + 1) * 8;
    do {
      lVar10 = lVar10 + 8;
      if (((uint)*(ulong *)pGVar7 >> 0x1e & 1) != 0) {
        *(ulong *)pGVar7 = *(ulong *)pGVar7 & 0xffffffffbfffffff;
        if (((ulong)pGVar7 & 1) != 0) {
LAB_0071cd31:
          __assert_fail("!Gia_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,0x120,"void Cbs_QuePush(Cbs_Que_t *, Gia_Obj_t *)");
        }
        iVar8 = (p->pClauses).iTail;
        if (iVar8 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar8 * 2;
          ppGVar4 = (p->pClauses).pData;
          if (ppGVar4 == (Gia_Obj_t **)0x0) {
            ppGVar4 = (Gia_Obj_t **)malloc((long)iVar8 << 4);
          }
          else {
            ppGVar4 = (Gia_Obj_t **)realloc(ppGVar4,(long)iVar8 << 4);
            iVar8 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = ppGVar4;
        }
        else {
          ppGVar4 = (p->pClauses).pData;
        }
        iVar5 = iVar8 + 1;
        (p->pClauses).iTail = iVar5;
        ppGVar4[iVar8] = pGVar7;
        uVar1 = pGVar7->Value;
        if (uVar1 == 0xffffffff) {
LAB_0071cd12:
          __assert_fail("pVar->Value != ~0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,99,"int Cbs_VarDecLevel(Cbs_Man_t *, Gia_Obj_t *)");
        }
        uVar3 = uVar1 * 3;
        if ((int)uVar3 < 0) {
LAB_0071ccf3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = p->vLevReas->nSize;
        if (uVar2 == uVar3 || SBORROW4(uVar2,uVar3) != (int)(uVar2 + uVar1 * -3) < 0)
        goto LAB_0071ccf3;
        iVar8 = p->vLevReas->pArray[uVar3];
        if (iVar6 <= iVar8) {
          iVar6 = iVar8;
        }
        ppGVar4 = (p->pClauses).pData;
      }
      pGVar7 = *(Gia_Obj_t **)((long)ppGVar4 + lVar10);
    } while (pGVar7 != (Gia_Obj_t *)0x0);
  }
  iVar8 = (p->pClauses).iHead;
  if (iVar8 + 1 < iVar5) {
    lVar10 = (long)iVar8 + 1;
    do {
      pGVar7 = (p->pClauses).pData[lVar10];
      *(ulong *)pGVar7 = *(ulong *)pGVar7 | 0x40000000;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->pClauses).iTail);
  }
  Cbs_ManDeriveReason(p,iVar6);
  iVar6 = (p->pClauses).iHead;
  iVar5 = (p->pClauses).iTail;
  if (iVar5 <= iVar6) {
    __assert_fail("p->iHead < p->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x172,"int Cbs_QueFinish(Cbs_Que_t *)");
  }
  if (iVar5 == (p->pClauses).nSize) {
    (p->pClauses).nSize = iVar5 * 2;
    ppGVar4 = (p->pClauses).pData;
    if (ppGVar4 == (Gia_Obj_t **)0x0) {
      ppGVar4 = (Gia_Obj_t **)malloc((long)iVar5 << 4);
    }
    else {
      ppGVar4 = (Gia_Obj_t **)realloc(ppGVar4,(long)iVar5 << 4);
      iVar5 = (p->pClauses).iTail;
    }
    (p->pClauses).pData = ppGVar4;
  }
  else {
    ppGVar4 = (p->pClauses).pData;
  }
  (p->pClauses).iTail = iVar5 + 1;
  ppGVar4[iVar5] = (Gia_Obj_t *)0x0;
  (p->pClauses).iHead = iVar5 + 1;
  return iVar6;
}

Assistant:

static inline int Cbs_ManResolve( Cbs_Man_t * p, int Level, int hClause0, int hClause1 )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj;
    int i, LevelMax = -1, LevelCur;
    assert( pQue->pData[hClause0] != NULL );
    assert( pQue->pData[hClause0] == pQue->pData[hClause1] );
/*
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fMark0 == 1 );
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
        assert( pObj->fMark0 == 1 );
*/
    assert( Cbs_QueIsEmpty( pQue ) );
    Cbs_QuePush( pQue, NULL );
    for ( i = hClause0 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Cbs_QuePush( pQue, pObj );
        LevelCur = Cbs_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = hClause1 + 1; (pObj = pQue->pData[i]); i++ )
    {
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Cbs_QuePush( pQue, pObj );
        LevelCur = Cbs_VarDecLevel( p, pObj );
        if ( LevelMax < LevelCur )
            LevelMax = LevelCur;
    }
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
        pQue->pData[i]->fMark0 = 1;
    Cbs_ManDeriveReason( p, LevelMax );
    return Cbs_QueFinish( pQue );
}